

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare_tests.c
# Opt level: O1

void cjson_compare_should_compare_booleans(void)

{
  cJSON_bool cVar1;
  
  cVar1 = compare_from_string("true","true",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x4b);
  }
  cVar1 = compare_from_string("true","true",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x4c);
  }
  cVar1 = compare_from_string("false","false",1);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x4f);
  }
  cVar1 = compare_from_string("false","false",0);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x50);
  }
  cVar1 = compare_from_string("true","false",1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x53);
  }
  cVar1 = compare_from_string("true","false",0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x54);
  }
  cVar1 = compare_from_string("false","true",1);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x55);
  }
  cVar1 = compare_from_string("false","true",0);
  if (cVar1 != 0) {
    UnityFail(" Expected FALSE Was TRUE",0x56);
    return;
  }
  return;
}

Assistant:

static void cjson_compare_should_compare_booleans(void)
{
    /* true */
    TEST_ASSERT_TRUE(compare_from_string("true", "true", true));
    TEST_ASSERT_TRUE(compare_from_string("true", "true", false));

    /* false */
    TEST_ASSERT_TRUE(compare_from_string("false", "false", true));
    TEST_ASSERT_TRUE(compare_from_string("false", "false", false));

    /* mixed */
    TEST_ASSERT_FALSE(compare_from_string("true", "false", true));
    TEST_ASSERT_FALSE(compare_from_string("true", "false", false));
    TEST_ASSERT_FALSE(compare_from_string("false", "true", true));
    TEST_ASSERT_FALSE(compare_from_string("false", "true", false));
}